

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O2

void __thiscall
FOptionMenuItemOptionBase::FOptionMenuItemOptionBase
          (FOptionMenuItemOptionBase *this,char *label,char *menu,char *values,char *graycheck,
          int center)

{
  FBaseCVar *pFVar1;
  FName local_34;
  
  FName::FName(&local_34,menu);
  FOptionMenuItem::FOptionMenuItem(&this->super_FOptionMenuItem,label,&local_34,false);
  (this->super_FOptionMenuItem).super_FListMenuItem._vptr_FListMenuItem =
       (_func_int **)&PTR__FOptionMenuItem_006e72c0;
  *(undefined4 *)&(this->super_FOptionMenuItem).field_0x24 = 0;
  FName::operator=((FName *)&(this->super_FOptionMenuItem).field_0x24,values);
  pFVar1 = FindCVar(graycheck,(FBaseCVar **)0x0);
  this->mGrayCheck = pFVar1;
  this->mCenter = center;
  return;
}

Assistant:

FOptionMenuItemOptionBase(const char *label, const char *menu, const char *values, const char *graycheck, int center)
		: FOptionMenuItem(label, menu)
	{
		mValues = values;
		mGrayCheck = (FBoolCVar*)FindCVar(graycheck, NULL);
		mCenter = center;
	}